

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::MaybeAppendDecimal(State *state,int val)

{
  char **str;
  bool local_41;
  char **local_40;
  char *p;
  char buf [20];
  size_t kMaxLength;
  int val_local;
  State *state_local;
  
  stack0xffffffffffffffe0 = 0x14;
  if (*(int *)&(state->parse_state).field_0xc < 0) {
    local_40 = (char **)(buf + 0xc);
    kMaxLength._4_4_ = val;
    do {
      str = (char **)((long)local_40 + -1);
      *(char *)((long)local_40 + -1) = (char)(kMaxLength._4_4_ % 10) + '0';
      kMaxLength._4_4_ = kMaxLength._4_4_ / 10;
      local_41 = &p < str && kMaxLength._4_4_ != 0;
      local_40 = str;
    } while (local_41);
    Append(state,(char *)str,0x14 - ((long)str - (long)&p));
  }
  return true;
}

Assistant:

static bool MaybeAppendDecimal(State *state, int val) {
  // Max {32-64}-bit unsigned int is 20 digits.
  constexpr size_t kMaxLength = 20;
  char buf[kMaxLength];

  // We can't use itoa or sprintf as neither is specified to be
  // async-signal-safe.
  if (state->parse_state.append) {
    // We can't have a one-before-the-beginning pointer, so instead start with
    // one-past-the-end and manipulate one character before the pointer.
    char *p = &buf[kMaxLength];
    do {  // val=0 is the only input that should write a leading zero digit.
      *--p = static_cast<char>((val % 10) + '0');
      val /= 10;
    } while (p > buf && val != 0);

    // 'p' landed on the last character we set.  How convenient.
    Append(state, p, kMaxLength - static_cast<size_t>(p - buf));
  }

  return true;
}